

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cpp
# Opt level: O0

void __thiscall CaDiCaL::Proof::add_constraint(Proof *this,vector<int,_std::allocator<int>_> *c)

{
  bool bVar1;
  const_iterator this_00;
  const_iterator __x;
  Proof *in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  int *lit;
  const_iterator __end1;
  const_iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *in_stack_ffffffffffffffd0
  ;
  
  this_00 = std::vector<int,_std::allocator<int>_>::begin(in_RDI);
  __x = std::vector<int,_std::allocator<int>_>::end(in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffffd0,
                       (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_RDI);
    if (!bVar1) break;
    in_stack_ffffffffffffffd0 =
         (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
         __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
         operator*((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                   &stack0xffffffffffffffe0);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)this_00._M_current,__x._M_current);
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
               &stack0xffffffffffffffe0);
  }
  add_constraint(in_RSI);
  return;
}

Assistant:

void Proof::add_constraint (const vector<int> &c) {
  // literals of c are already external
  assert (clause.empty ());
  assert (proof_chain.empty ());
  for (const auto &lit : c)
    clause.push_back (lit);
  add_constraint ();
}